

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

void gdImageStringUp(gdImagePtr im,gdFontPtr f,int x,int y,uchar *s,int color)

{
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = strlen((char *)s);
  if (0 < (int)(uint)sVar1) {
    uVar2 = 0;
    do {
      gdImageCharUp(im,f,x,y,(uint)s[uVar2],color);
      y = y - f->w;
      uVar2 = uVar2 + 1;
    } while (((uint)sVar1 & 0x7fffffff) != uVar2);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageStringUp (gdImagePtr im, gdFontPtr f,
								   int x, int y, unsigned char *s, int color)
{
	int i;
	int l;
	l = strlen ((char *) s);
	for (i = 0; (i < l); i++) {
		gdImageCharUp (im, f, x, y, s[i], color);
		y -= f->w;
	}
}